

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCommitPhaseOne(Btree *p,char *zSuperJrnl)

{
  uint uVar1;
  BtShared *pBVar2;
  BtShared *pBt;
  Pager *pPVar3;
  sqlite3 *psVar4;
  u8 *puVar5;
  int iVar6;
  Pgno PVar7;
  u32 uVar8;
  u32 nFree;
  ulong uVar9;
  ulong uVar10;
  Pgno pgno;
  ulong uVar11;
  Btree **ppBVar12;
  
  if (p->inTrans != '\x02') {
    return 0;
  }
  pBVar2 = p->pBt;
  sqlite3BtreeEnter(p);
  if (pBVar2->autoVacuum != '\0') {
    pBt = p->pBt;
    pPVar3 = pBt->pPager;
    invalidateAllOverflowCache(pBt);
    if (pBt->incrVacuum == '\0') {
      pgno = pBt->nPage;
      PVar7 = ptrmapPageno(pBt,pgno);
      if ((PVar7 == pgno) || (uVar1 = pBt->pageSize, pgno == (uint)sqlite3PendingByte / uVar1 + 1))
      {
        iVar6 = 0x119c9;
      }
      else {
        uVar8 = sqlite3Get4byte(pBt->pPage1->aData + 0x24);
        psVar4 = p->db;
        nFree = uVar8;
        if (psVar4->xAutovacPages != (_func_uint_void_ptr_char_ptr_u32_u32_u32 *)0x0) {
          uVar11 = 0;
          uVar9 = (ulong)(uint)psVar4->nDb;
          if (psVar4->nDb < 1) {
            uVar9 = uVar11;
          }
          for (ppBVar12 = &psVar4->aDb->pBt;
              (uVar10 = uVar9, uVar9 != uVar11 && (uVar10 = uVar11, *ppBVar12 != p));
              ppBVar12 = ppBVar12 + 4) {
            uVar11 = uVar11 + 1;
          }
          nFree = (*psVar4->xAutovacPages)
                            (psVar4->pAutovacPagesArg,psVar4->aDb[uVar10].zDbSName,pgno,uVar8,uVar1)
          ;
          if (uVar8 <= nFree) {
            nFree = uVar8;
          }
          if (nFree == 0) goto LAB_0014d067;
        }
        PVar7 = finalDbSize(pBt,pgno,nFree);
        if (PVar7 <= pgno) {
          iVar6 = 0;
          if (PVar7 < pgno) {
            iVar6 = saveAllCursors(pBt,0,(BtCursor *)0x0);
          }
          while ((PVar7 < pgno && (iVar6 == 0))) {
            iVar6 = incrVacuumStep(pBt,PVar7,pgno,(uint)(nFree == uVar8));
            pgno = pgno - 1;
          }
          if ((iVar6 == 0x65 || iVar6 == 0) && (uVar8 != 0)) {
            iVar6 = sqlite3PagerWrite(pBt->pPage1->pDbPage);
            if (nFree == uVar8) {
              puVar5 = pBt->pPage1->aData;
              puVar5[0x20] = '\0';
              puVar5[0x21] = '\0';
              puVar5[0x22] = '\0';
              puVar5[0x23] = '\0';
              puVar5 = pBt->pPage1->aData;
              puVar5[0x24] = '\0';
              puVar5[0x25] = '\0';
              puVar5[0x26] = '\0';
              puVar5[0x27] = '\0';
            }
            *(Pgno *)(pBt->pPage1->aData + 0x1c) =
                 PVar7 >> 0x18 | (PVar7 & 0xff0000) >> 8 | (PVar7 & 0xff00) << 8 | PVar7 << 0x18;
            pBt->bDoTruncate = '\x01';
            pBt->nPage = PVar7;
          }
          if (iVar6 != 0) {
            sqlite3PagerRollback(pPVar3);
            goto LAB_0014d0bf;
          }
          goto LAB_0014d067;
        }
        iVar6 = 0x119e4;
      }
      iVar6 = sqlite3CorruptError(iVar6);
      goto LAB_0014d0bf;
    }
  }
LAB_0014d067:
  pPVar3 = pBVar2->pPager;
  if (pBVar2->bDoTruncate != '\0') {
    pPVar3->dbSize = pBVar2->nPage;
  }
  iVar6 = sqlite3PagerCommitPhaseOne(pPVar3,zSuperJrnl,0);
LAB_0014d0bf:
  sqlite3BtreeLeave(p);
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseOne(Btree *p, const char *zSuperJrnl){
  int rc = SQLITE_OK;
  if( p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      rc = autoVacuumCommit(p);
      if( rc!=SQLITE_OK ){
        sqlite3BtreeLeave(p);
        return rc;
      }
    }
    if( pBt->bDoTruncate ){
      sqlite3PagerTruncateImage(pBt->pPager, pBt->nPage);
    }
#endif
    rc = sqlite3PagerCommitPhaseOne(pBt->pPager, zSuperJrnl, 0);
    sqlite3BtreeLeave(p);
  }
  return rc;
}